

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * __thiscall duckdb::Value::operator=(Value *this,Value *other)

{
  int64_t iVar1;
  
  if (this != other) {
    (this->type_).id_ = (other->type_).id_;
    (this->type_).physical_type_ = (other->type_).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(this->type_).type_info_,&(other->type_).type_info_);
    this->is_null = other->is_null;
    iVar1 = (other->value_).hugeint.upper;
    (this->value_).bigint = (other->value_).bigint;
    (this->value_).hugeint.upper = iVar1;
    shared_ptr<duckdb::ExtraValueInfo,_true>::operator=(&this->value_info_,&other->value_info_);
  }
  return this;
}

Assistant:

Value &Value::operator=(const Value &other) {
	if (this == &other) {
		return *this;
	}
	type_ = other.type_;
	is_null = other.is_null;
	value_ = other.value_;
	value_info_ = other.value_info_;
	return *this;
}